

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall
bloaty::RangeSink::AddFileRangeForFileRange
          (RangeSink *this,char *analyzer,string_view from_file_range,string_view file_range)

{
  pointer ppVar1;
  bool verbose;
  bool bVar2;
  char *pcVar3;
  uint64_t addr;
  uint64_t size;
  uint64_t filesize;
  uint64_t fileoff;
  pointer ppVar4;
  string_view format;
  DualMap *a2;
  string label;
  Arg local_e0;
  string local_b0;
  Arg local_90;
  Arg local_60;
  
  filesize = file_range._M_len;
  size = from_file_range._M_len;
  pcVar3 = (this->file_->data_)._M_str;
  fileoff = (long)file_range._M_str - (long)pcVar3;
  addr = (long)from_file_range._M_str - (long)pcVar3;
  verbose = IsVerboseForFileRange(this,fileoff,filesize);
  if (verbose) {
    pcVar3 = GetDataSourceLabel(this->data_source_);
    printf("[%s, %s] AddFileRangeForFileRange([%lx, %zx], [%lx, %zx])\n",pcVar3,analyzer,addr,size,
           fileoff,filesize);
  }
  if (this->translator_ != (DualMap *)0x0) {
    ppVar1 = (this->outputs_).
             super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar4 = (this->outputs_).
                  super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar1; ppVar4 = ppVar4 + 1)
    {
      label._M_dataplus._M_p = (pointer)&label.field_2;
      label._M_string_length = 0;
      label.field_2._M_local_buf[0] = '\0';
      bVar2 = RangeMap::TryGetLabelForRange(&ppVar4->first->file_map,addr,size,&label);
      if (bVar2) {
        a2 = ppVar4->first;
        bVar2 = RangeMap::AddRangeWithTranslation
                          (&a2->file_map,fileoff,filesize,&label,&this->translator_->file_map,
                           verbose,&a2->vm_map);
        if (!bVar2 && 0 < verbose_level) {
          absl::substitute_internal::Arg::Arg(&local_90,fileoff);
          absl::substitute_internal::Arg::Arg(&local_60,filesize);
          local_e0.piece_._M_len = label._M_string_length;
          local_e0.piece_._M_str = label._M_dataplus._M_p;
          format._M_str = (char *)&local_90;
          format._M_len = (size_t)"File range ($0, $1) for label $2 extends beyond base map";
          absl::Substitute_abi_cxx11_(&local_b0,(absl *)0x38,format,&local_60,&local_e0,(Arg *)a2);
          printf("WARNING: %s\n",local_b0._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_b0);
        }
      }
      else if (1 < verbose_level) {
        printf("No label found for file range [%lx, %zx]\n",addr,size);
      }
      std::__cxx11::string::~string((string *)&label);
    }
    return;
  }
  __assert_fail("translator_",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc",
                0x4d4,
                "void bloaty::RangeSink::AddFileRangeForFileRange(const char *, std::string_view, std::string_view)"
               );
}

Assistant:

void RangeSink::AddFileRangeForFileRange(const char* analyzer,
                                         std::string_view from_file_range,
                                         std::string_view file_range) {
  uint64_t file_offset = file_range.data() - file_->data().data();
  uint64_t from_file_offset = from_file_range.data() - file_->data().data();
  bool verbose = IsVerboseForFileRange(file_offset, file_range.size());
  if (verbose) {
    printf("[%s, %s] AddFileRangeForFileRange([%" PRIx64 ", %zx], [%" PRIx64
           ", %zx])\n",
           GetDataSourceLabel(data_source_), analyzer, from_file_offset,
           from_file_range.size(), file_offset, file_range.size());
  }
  assert(translator_);
  for (auto& pair : outputs_) {
    std::string label;
    if (pair.first->file_map.TryGetLabelForRange(
            from_file_offset, from_file_range.size(), &label)) {
      bool ok = pair.first->file_map.AddRangeWithTranslation(
          file_offset, file_range.size(), label, translator_->file_map, verbose,
          &pair.first->vm_map);
      if (!ok) {
        WARN("File range ($0, $1) for label $2 extends beyond base map",
             file_offset, file_range.size(), label);
      }
    } else if (verbose_level > 1) {
      printf("No label found for file range [%" PRIx64 ", %zx]\n",
             from_file_offset, from_file_range.size());
    }
  }
}